

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

FilterPropagateResult
duckdb::CheckZonemapTemplated<duckdb::hugeint_t>
          (BaseStatistics *stats,ExpressionType comparison_type,hugeint_t min_value,
          hugeint_t max_value,hugeint_t constant)

{
  FilterPropagateResult FVar1;
  InternalException *this;
  FilterPropagateResult FVar2;
  int iVar3;
  undefined7 in_register_00000031;
  bool bVar4;
  allocator local_59;
  hugeint_t max_value_local;
  hugeint_t min_value_local;
  string local_38;
  
  max_value_local.upper = max_value.upper;
  max_value_local.lower = max_value.lower;
  min_value_local.upper = min_value.upper;
  min_value_local.lower = min_value.lower;
  iVar3 = (int)CONCAT71(in_register_00000031,comparison_type);
  if (0xf < iVar3 - 0x19U) {
switchD_00519cd3_caseD_1f:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Expression type in zonemap check not implemented",&local_59);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  switch(iVar3) {
  case 0x19:
  case 0x28:
    if ((constant.upper == min_value_local.upper && constant.lower == min_value_local.lower) &&
       (min_value_local.upper == max_value_local.upper &&
        min_value_local.lower == max_value_local.lower)) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.upper < min_value_local.upper) {
      return FILTER_ALWAYS_FALSE;
    }
    if (constant.lower < min_value_local.lower && constant.upper == min_value_local.upper) {
      return FILTER_ALWAYS_FALSE;
    }
    FVar2 = (constant.upper == max_value_local.upper) * '\x02';
    if (constant.lower <= max_value_local.lower) {
      FVar2 = NO_PRUNING_POSSIBLE;
    }
    FVar1 = FILTER_ALWAYS_FALSE;
    goto LAB_00519dee;
  case 0x1a:
  case 0x25:
    if (constant.upper < min_value_local.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.lower < min_value_local.lower && constant.upper == min_value_local.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (max_value_local.upper < constant.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (max_value_local.lower < constant.lower && constant.upper == max_value_local.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.lower != min_value_local.lower || constant.upper != min_value_local.upper) {
      return NO_PRUNING_POSSIBLE;
    }
    bVar4 = min_value_local.upper == max_value_local.upper &&
            min_value_local.lower == max_value_local.lower;
    goto LAB_00519e7c;
  case 0x1b:
    if (max_value_local.upper < constant.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (max_value_local.lower < constant.lower && constant.upper == max_value_local.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    FVar2 = FILTER_ALWAYS_FALSE;
    if (min_value_local.lower < constant.lower) {
      FVar2 = (constant.upper != min_value_local.upper) * '\x02';
    }
    FVar1 = NO_PRUNING_POSSIBLE;
    max_value_local.upper = min_value_local.upper;
LAB_00519dee:
    if (constant.upper <= max_value_local.upper) {
      FVar1 = FVar2;
    }
    return FVar1;
  case 0x1c:
    if (constant.upper < min_value_local.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.lower < min_value_local.lower && constant.upper == min_value_local.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    FVar2 = FILTER_ALWAYS_FALSE;
    if (constant.lower < max_value_local.lower) {
      FVar2 = (constant.upper != max_value_local.upper) * '\x02';
    }
    if (constant.upper < max_value_local.upper) {
      return NO_PRUNING_POSSIBLE;
    }
    return FVar2;
  case 0x1d:
    bVar4 = LessThanEquals::Operation<duckdb::hugeint_t>(&max_value_local,&constant);
    if (bVar4) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar4 = LessThanEquals::Operation<duckdb::hugeint_t>(&min_value_local,&constant);
    break;
  case 0x1e:
    bVar4 = GreaterThanEquals::Operation<duckdb::hugeint_t>(&min_value_local,&constant);
    if (bVar4) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar4 = GreaterThanEquals::Operation<duckdb::hugeint_t>(&max_value_local,&constant);
    break;
  default:
    goto switchD_00519cd3_caseD_1f;
  }
  bVar4 = (bool)(bVar4 ^ 1);
LAB_00519e7c:
  return bVar4 * '\x02';
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type, T min_value,
                                            T max_value, T constant) {
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		if (ConstantExactRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		if (ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_DISTINCT_FROM:
		if (!ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (ConstantExactRange(min_value, max_value, constant)) {
			// corner case of a cluster with one numeric equal to the target constant
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// GreaterThanEquals::Operation(X, C)
		// this can be true only if max(X) >= C
		// if min(X) >= C, then this is always true
		if (GreaterThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_GREATERTHAN:
		// GreaterThan::Operation(X, C)
		// this can be true only if max(X) > C
		// if min(X) > C, then this is always true
		if (GreaterThan::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThan::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// LessThanEquals::Operation(X, C)
		// this can be true only if min(X) <= C
		// if max(X) <= C, then this is always true
		if (LessThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHAN:
		// LessThan::Operation(X, C)
		// this can be true only if min(X) < C
		// if max(X) < C, then this is always true
		if (LessThan::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThan::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	default:
		throw InternalException("Expression type in zonemap check not implemented");
	}
}